

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,TextGenerator *generator)

{
  long lVar1;
  undefined1 auVar2 [8];
  pointer ppFVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  const_iterator cVar6;
  ulong uVar7;
  UnknownFieldSet *unknown_fields_00;
  Reflection *this_00;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  long lVar8;
  pointer ppFVar9;
  ZeroCopyInputStream local_a8;
  Descriptor *descriptor;
  undefined1 auStack_88 [8];
  UnknownFieldSet unknown_fields;
  undefined1 auStack_58 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  if (this_00 == (Reflection *)0x0) {
    auStack_88 = (undefined1  [8])0x0;
    unknown_fields.fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unknown_fields.fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    MessageLite::SerializeAsString_abi_cxx11_((string *)auStack_58,&message->super_MessageLite);
    io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)&stack0xffffffffffffff58,(void *)auStack_58,
               (int)fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,-1);
    UnknownFieldSet::ParseFromZeroCopyStream((UnknownFieldSet *)auStack_88,&stack0xffffffffffffff58)
    ;
    std::__cxx11::string::~string((string *)auStack_58);
    PrintUnknownFields(this,(UnknownFieldSet *)auStack_88,generator,10);
    UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)auStack_88);
  }
  else {
    iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
    local_a8._vptr_ZeroCopyInputStream = (_func_int **)CONCAT44(extraout_var,iVar5);
    cVar6 = std::
            _Rb_tree<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
            ::find(&(this->custom_message_printers_)._M_t,(key_type *)&stack0xffffffffffffff58);
    if ((_Rb_tree_header *)cVar6._M_node ==
        &(this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header) {
      bVar4 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )(local_a8._vptr_ZeroCopyInputStream + 1),"google.protobuf.Any");
      if (((bVar4) && (this->expand_any_ == true)) &&
         (bVar4 = PrintAny(this,message,generator), bVar4)) {
        return;
      }
      auStack_58 = (undefined1  [8])0x0;
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (*(char *)(*(long *)(local_a8._vptr_ZeroCopyInputStream + 4) + 0x4b) == '\x01') {
        auStack_88 = *(undefined1 (*) [8])(local_a8._vptr_ZeroCopyInputStream + 5);
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)auStack_58,(FieldDescriptor **)auStack_88);
        auStack_88 = (undefined1  [8])(*(long *)(local_a8._vptr_ZeroCopyInputStream + 5) + 0x98);
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)auStack_58,(FieldDescriptor **)auStack_88);
      }
      else {
        Reflection::ListFields
                  (this_00,message,
                   (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)auStack_58);
      }
      ppFVar3 = fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar2 = auStack_58;
      if ((this->print_message_fields_in_index_order_ == true) &&
         (auStack_58 !=
          (undefined1  [8])
          fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        lVar8 = (long)fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58;
        uVar7 = lVar8 >> 3;
        lVar1 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                  (auStack_58,
                   fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar8 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                    (auVar2,ppFVar3);
        }
        else {
          ppFVar9 = (pointer)((long)auVar2 + 0x80);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                    (auVar2,ppFVar9);
          for (; ppFVar9 != ppFVar3; ppFVar9 = ppFVar9 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                      (ppFVar9);
          }
        }
      }
      for (uVar7 = 0;
          uVar7 < (ulong)((long)fields.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3);
          uVar7 = uVar7 + 1) {
        PrintField(this,message,this_00,*(FieldDescriptor **)((long)auStack_58 + uVar7 * 8),
                   generator);
      }
      if (this->hide_unknown_fields_ == false) {
        unknown_fields_00 = Reflection::GetUnknownFields(this_00,message);
        PrintUnknownFields(this,unknown_fields_00,generator,10);
      }
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)auStack_58);
    }
    else {
      (**(code **)(*(long *)cVar6._M_node[1]._M_parent + 0x10))
                (cVar6._M_node[1]._M_parent,message,this->single_line_mode_,generator);
    }
  }
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                TextGenerator* generator) const {
  const Reflection* reflection = message.GetReflection();
  if (!reflection) {
    // This message does not provide any way to describe its structure.
    // Parse it again in an UnknownFieldSet, and display this instead.
    UnknownFieldSet unknown_fields;
    {
      std::string serialized = message.SerializeAsString();
      io::ArrayInputStream input(serialized.data(), serialized.size());
      unknown_fields.ParseFromZeroCopyStream(&input);
    }
    PrintUnknownFields(unknown_fields, generator, kUnknownFieldRecursionLimit);
    return;
  }
  const Descriptor* descriptor = message.GetDescriptor();
  auto itr = custom_message_printers_.find(descriptor);
  if (itr != custom_message_printers_.end()) {
    itr->second->Print(message, single_line_mode_, generator);
    return;
  }
  if (descriptor->full_name() == internal::kAnyFullTypeName && expand_any_ &&
      PrintAny(message, generator)) {
    return;
  }
  std::vector<const FieldDescriptor*> fields;
  if (descriptor->options().map_entry()) {
    fields.push_back(descriptor->field(0));
    fields.push_back(descriptor->field(1));
  } else {
    reflection->ListFields(message, &fields);
  }

  if (print_message_fields_in_index_order_) {
    std::sort(fields.begin(), fields.end(), FieldIndexSorter());
  }
  for (int i = 0; i < fields.size(); i++) {
    PrintField(message, reflection, fields[i], generator);
  }
  if (!hide_unknown_fields_) {
    PrintUnknownFields(reflection->GetUnknownFields(message), generator,
                       kUnknownFieldRecursionLimit);
  }
}